

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O1

bool __thiscall Func::IsSwitchOptDisabled(Func *this)

{
  bool bVar1;
  JITTimeFunctionBody *pJVar2;
  JITTimeProfileInfo *this_00;
  
  pJVar2 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
  bVar1 = JITTimeFunctionBody::HasProfileInfo(pJVar2);
  if (bVar1) {
    pJVar2 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
    this_00 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar2);
    bVar1 = JITTimeProfileInfo::IsSwitchOptDisabled(this_00);
    if (bVar1) {
      return true;
    }
  }
  bVar1 = JITOutput::IsSwitchOptDisabled(&this->m_output);
  return bVar1;
}

Assistant:

bool
Func::IsSwitchOptDisabled() const
{
    return (HasProfileInfo() && GetReadOnlyProfileInfo()->IsSwitchOptDisabled()) || m_output.IsSwitchOptDisabled();
}